

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateReductionTypeLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  uint32 uVar3;
  Rep *pRVar4;
  unsigned_long uVar5;
  bool bVar6;
  long *plVar7;
  unsigned_long *puVar8;
  size_type *psVar9;
  unsigned_long *puVar10;
  long lVar11;
  string err;
  undefined1 local_98 [8];
  _Alloc_hider local_90;
  undefined1 local_88 [24];
  pointer local_70;
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  Result::Result((Result *)&local_70);
  validateInputCount((Result *)local_98,layer,1,1);
  local_70 = (pointer)local_98;
  std::__cxx11::string::operator=((string *)&local_68,(string *)&local_90);
  if (local_90._M_p != local_88 + 8) {
    operator_delete(local_90._M_p,local_88._8_8_ + 1);
  }
  bVar6 = Result::good((Result *)&local_70);
  if (bVar6) {
    validateOutputCount((Result *)local_98,layer,1,1);
    local_70 = (pointer)local_98;
    std::__cxx11::string::operator=((string *)&local_68,(string *)&local_90);
    if (local_90._M_p != local_88 + 8) {
      operator_delete(local_90._M_p,local_88._8_8_ + 1);
    }
  }
  if (0 < (layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_) {
    iVar2 = *(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                    0x24);
    lVar11 = (long)iVar2;
    std::operator+(&local_48,
                   "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'",
                   (layer->name_).ptr_);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_48);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar9) {
      local_88._0_8_ = *psVar9;
      local_88._8_8_ = plVar7[3];
      local_98 = (undefined1  [8])local_88;
    }
    else {
      local_88._0_8_ = *psVar9;
      local_98 = (undefined1  [8])*plVar7;
    }
    local_90._M_p = (pointer)plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    uVar3 = layer->_oneof_case_[0];
    if ((int)uVar3 < 0x4fb) {
      if ((int)uVar3 < 0x4ec) {
        if (uVar3 == 0x4e2) {
          pRVar4 = (((layer->layer_).convolution_)->kernelsize_).rep_;
          puVar8 = pRVar4->elements;
          if (pRVar4 == (Rep *)0x0) {
            puVar8 = (unsigned_long *)0x0;
          }
          puVar10 = pRVar4->elements + (((layer->layer_).convolution_)->kernelsize_).current_size_;
          if (pRVar4 == (Rep *)0x0) {
            puVar10 = (unsigned_long *)0x0;
          }
          if (puVar8 != puVar10) {
            do {
              uVar5 = *puVar8;
              if ((SBORROW8(uVar5,-lVar11) != (long)(uVar5 + lVar11) < 0) || (lVar11 <= (long)uVar5)
                 ) {
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
                goto LAB_002d49cf;
              }
              puVar8 = puVar8 + 1;
            } while (puVar8 != puVar10);
          }
        }
        else if (uVar3 == 0x4e7) {
          pRVar4 = (((layer->layer_).convolution_)->kernelsize_).rep_;
          puVar8 = pRVar4->elements;
          if (pRVar4 == (Rep *)0x0) {
            puVar8 = (unsigned_long *)0x0;
          }
          puVar10 = pRVar4->elements + (((layer->layer_).convolution_)->kernelsize_).current_size_;
          if (pRVar4 == (Rep *)0x0) {
            puVar10 = (unsigned_long *)0x0;
          }
          if (puVar8 != puVar10) {
            do {
              uVar5 = *puVar8;
              if ((SBORROW8(uVar5,-lVar11) != (long)(uVar5 + lVar11) < 0) || (lVar11 <= (long)uVar5)
                 ) {
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
                goto LAB_002d49cf;
              }
              puVar8 = puVar8 + 1;
            } while (puVar8 != puVar10);
          }
        }
      }
      else if (uVar3 == 0x4ec) {
        pRVar4 = (((layer->layer_).convolution_)->kernelsize_).rep_;
        puVar8 = pRVar4->elements;
        if (pRVar4 == (Rep *)0x0) {
          puVar8 = (unsigned_long *)0x0;
        }
        puVar10 = pRVar4->elements + (((layer->layer_).convolution_)->kernelsize_).current_size_;
        if (pRVar4 == (Rep *)0x0) {
          puVar10 = (unsigned_long *)0x0;
        }
        if (puVar8 != puVar10) {
          do {
            uVar5 = *puVar8;
            if ((SBORROW8(uVar5,-lVar11) != (long)(uVar5 + lVar11) < 0) || (lVar11 <= (long)uVar5))
            {
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
              goto LAB_002d49cf;
            }
            puVar8 = puVar8 + 1;
          } while (puVar8 != puVar10);
        }
      }
      else if (uVar3 == 0x4f1) {
        pRVar4 = (((layer->layer_).convolution_)->kernelsize_).rep_;
        puVar8 = pRVar4->elements;
        if (pRVar4 == (Rep *)0x0) {
          puVar8 = (unsigned_long *)0x0;
        }
        puVar10 = pRVar4->elements + (((layer->layer_).convolution_)->kernelsize_).current_size_;
        if (pRVar4 == (Rep *)0x0) {
          puVar10 = (unsigned_long *)0x0;
        }
        if (puVar8 != puVar10) {
          do {
            uVar5 = *puVar8;
            if ((SBORROW8(uVar5,-lVar11) != (long)(uVar5 + lVar11) < 0) || (lVar11 <= (long)uVar5))
            {
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
              goto LAB_002d49cf;
            }
            puVar8 = puVar8 + 1;
          } while (puVar8 != puVar10);
        }
      }
      else if (uVar3 == 0x4f6) {
        pRVar4 = (((layer->layer_).convolution_)->kernelsize_).rep_;
        puVar8 = pRVar4->elements;
        if (pRVar4 == (Rep *)0x0) {
          puVar8 = (unsigned_long *)0x0;
        }
        puVar10 = pRVar4->elements + (((layer->layer_).convolution_)->kernelsize_).current_size_;
        if (pRVar4 == (Rep *)0x0) {
          puVar10 = (unsigned_long *)0x0;
        }
        if (puVar8 != puVar10) {
          do {
            if (((long)*puVar8 < (long)-iVar2) || (lVar11 <= (long)*puVar8)) {
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
LAB_002d49cf:
              if (local_98 != (undefined1  [8])local_88) {
                operator_delete((void *)local_98,local_88._0_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_p == &local_58) {
                return __return_storage_ptr__;
              }
              operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
              return __return_storage_ptr__;
            }
            puVar8 = puVar8 + 1;
          } while (puVar8 != puVar10);
        }
      }
    }
    else if ((int)uVar3 < 0x505) {
      if (uVar3 == 0x4fb) {
        pRVar4 = (((layer->layer_).convolution_)->kernelsize_).rep_;
        puVar8 = pRVar4->elements;
        if (pRVar4 == (Rep *)0x0) {
          puVar8 = (unsigned_long *)0x0;
        }
        puVar10 = pRVar4->elements + (((layer->layer_).convolution_)->kernelsize_).current_size_;
        if (pRVar4 == (Rep *)0x0) {
          puVar10 = (unsigned_long *)0x0;
        }
        if (puVar8 != puVar10) {
          do {
            if (((long)*puVar8 < (long)-iVar2) || (lVar11 <= (long)*puVar8)) {
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
              goto LAB_002d49cf;
            }
            puVar8 = puVar8 + 1;
          } while (puVar8 != puVar10);
        }
      }
      else if (uVar3 == 0x500) {
        pRVar4 = (((layer->layer_).convolution_)->kernelsize_).rep_;
        puVar8 = pRVar4->elements;
        if (pRVar4 == (Rep *)0x0) {
          puVar8 = (unsigned_long *)0x0;
        }
        puVar10 = pRVar4->elements + (((layer->layer_).convolution_)->kernelsize_).current_size_;
        if (pRVar4 == (Rep *)0x0) {
          puVar10 = (unsigned_long *)0x0;
        }
        if (puVar8 != puVar10) {
          do {
            if (((long)*puVar8 < (long)-iVar2) || (lVar11 <= (long)*puVar8)) {
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
              goto LAB_002d49cf;
            }
            puVar8 = puVar8 + 1;
          } while (puVar8 != puVar10);
        }
      }
    }
    else if (uVar3 == 0x505) {
      pRVar4 = (((layer->layer_).convolution_)->kernelsize_).rep_;
      puVar8 = pRVar4->elements;
      if (pRVar4 == (Rep *)0x0) {
        puVar8 = (unsigned_long *)0x0;
      }
      puVar10 = pRVar4->elements + (((layer->layer_).convolution_)->kernelsize_).current_size_;
      if (pRVar4 == (Rep *)0x0) {
        puVar10 = (unsigned_long *)0x0;
      }
      if (puVar8 != puVar10) {
        do {
          if (((long)*puVar8 < (long)-iVar2) || (lVar11 <= (long)*puVar8)) {
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
            goto LAB_002d49cf;
          }
          puVar8 = puVar8 + 1;
        } while (puVar8 != puVar10);
      }
    }
    else if (uVar3 == 0x50a) {
      pRVar4 = (((layer->layer_).convolution_)->kernelsize_).rep_;
      puVar8 = pRVar4->elements;
      if (pRVar4 == (Rep *)0x0) {
        puVar8 = (unsigned_long *)0x0;
      }
      puVar10 = pRVar4->elements + (((layer->layer_).convolution_)->kernelsize_).current_size_;
      if (pRVar4 == (Rep *)0x0) {
        puVar10 = (unsigned_long *)0x0;
      }
      if (puVar8 != puVar10) {
        do {
          if (((long)*puVar8 < (long)-iVar2) || (lVar11 <= (long)*puVar8)) {
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
            goto LAB_002d49cf;
          }
          puVar8 = puVar8 + 1;
        } while (puVar8 != puVar10);
      }
    }
    else if (uVar3 == 0x50f) {
      pRVar4 = (((layer->layer_).convolution_)->kernelsize_).rep_;
      puVar8 = pRVar4->elements;
      if (pRVar4 == (Rep *)0x0) {
        puVar8 = (unsigned_long *)0x0;
      }
      puVar10 = pRVar4->elements + (((layer->layer_).convolution_)->kernelsize_).current_size_;
      if (pRVar4 == (Rep *)0x0) {
        puVar10 = (unsigned_long *)0x0;
      }
      if (puVar8 != puVar10) {
        do {
          if (((long)*puVar8 < (long)-iVar2) || (lVar11 <= (long)*puVar8)) {
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_98);
            goto LAB_002d49cf;
          }
          puVar8 = puVar8 + 1;
        } while (puVar8 != puVar10);
      }
    }
    if (local_98 != (undefined1  [8])local_88) {
      operator_delete((void *)local_98,local_88._0_8_ + 1);
    }
  }
  *(pointer *)__return_storage_ptr__ = local_70;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_p == &local_58) {
    paVar1->_M_allocated_capacity = local_58._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_58._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_68._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         local_58._M_allocated_capacity;
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_60;
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateReductionTypeLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    // all given axes should be in range [-inputRank : inputRank)
    if (layer.inputtensor_size() > 0) {
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";

        switch (layer.layer_case()) {
            case Specification::NeuralNetworkLayer::LayerCase::kReduceL1:
                for (const auto& axis : layer.reducel1().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceL2:
                for (const auto& axis : layer.reducel2().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceMax:
                for (const auto& axis : layer.reducemax().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceMin:
                for (const auto& axis : layer.reducemin().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceSum:
                for (const auto& axis : layer.reducesum().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceProd:
                for (const auto& axis : layer.reduceprod().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceMean:
                for (const auto& axis : layer.reducemean().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceLogSum:
                for (const auto& axis : layer.reducelogsum().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceSumSquare:
                for (const auto& axis : layer.reducesumsquare().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceLogSumExp:
                for (const auto& axis : layer.reducelogsumexp().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;

            default:
                break;
        }
    }
    return r;
}